

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O0

bool InquisitorCheckDistance(AActor *self)

{
  bool bVar1;
  AActor *pAVar2;
  double dVar3;
  AActor *self_local;
  
  if (self->reactiontime == 0) {
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self->target);
    bVar1 = P_CheckSight(self,pAVar2,0);
    if (bVar1) {
      pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self->target);
      dVar3 = AActor::Distance2D(self,pAVar2,false);
      return dVar3 < 264.0;
    }
  }
  return false;
}

Assistant:

bool InquisitorCheckDistance (AActor *self)
{
	if (self->reactiontime == 0 && P_CheckSight (self, self->target))
	{
		return self->Distance2D (self->target) < 264.;
	}
	return false;
}